

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  char cVar1;
  size_t sVar2;
  Ch *pCVar3;
  char *pcVar4;
  Ch c;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  copy;
  
  while (((ulong)(byte)*is->current_ < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)*is->current_ & 0x3f) & 1) != 0))) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  }
LAB_0013f534:
  if (*is->current_ == '/') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    if (*is->current_ == '*') {
      do {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        while( true ) {
          pcVar4 = is->current_;
          if (*pcVar4 != '*') break;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          if (*is->current_ == '/') goto LAB_0013f519;
        }
      } while (*pcVar4 != '\0');
    }
    else {
      if (*is->current_ == '/') {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        do {
          cVar1 = *is->current_;
          if (cVar1 == '\0') goto LAB_0013f521;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          if (cVar1 == '\n') goto LAB_0013f521;
        } while( true );
      }
      pcVar4 = is->current_;
    }
    sVar2 = is->count_;
    pCVar3 = is->buffer_;
    *(undefined4 *)(this + 0x30) = 0x11;
    *(char **)(this + 0x38) = pcVar4 + (sVar2 - (long)pCVar3);
  }
  return;
LAB_0013f519:
  do {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
LAB_0013f521:
  } while (((ulong)(byte)*is->current_ < 0x21) &&
          ((0x100002600U >> ((ulong)(byte)*is->current_ & 0x3f) & 1) != 0));
  goto LAB_0013f534;
}

Assistant:

void SkipWhitespaceAndComments(InputStream& is) {
        SkipWhitespace(is);

        if (parseFlags & kParseCommentsFlag) {
            while (RAPIDJSON_UNLIKELY(Consume(is, '/'))) {
                if (Consume(is, '*')) {
                    while (true) {
                        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
                            RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());
                        else if (Consume(is, '*')) {
                            if (Consume(is, '/'))
                                break;
                        }
                        else
                            is.Take();
                    }
                }
                else if (RAPIDJSON_LIKELY(Consume(is, '/')))
                    while (is.Peek() != '\0' && is.Take() != '\n') {}
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());

                SkipWhitespace(is);
            }
        }
    }